

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_connection_special_cmd(PacketProtocolLayer *ppl,SessionSpecialCode code,int arg)

{
  PktOut *pPVar1;
  PktOut *pktout;
  ssh1_connection_state *s;
  int arg_local;
  SessionSpecialCode code_local;
  PacketProtocolLayer *ppl_local;
  
  if ((code == SS_PING) || (code == SS_NOP)) {
    if ((ppl->remote_bugs & 1) == 0) {
      pPVar1 = ssh_bpp_new_pktout(ppl->bpp,0x20);
      BinarySink_put_stringz(pPVar1->binarysink_,anon_var_dwarf_2471b + 10);
      pq_base_push(&ppl->out_pq->pqb,&pPVar1->qnode);
    }
  }
  else if (ppl[-2].out_pq != (PktOutQueue *)0x0) {
    mainchan_special_cmd((mainchan *)ppl[-2].out_pq,code,arg);
  }
  return;
}

Assistant:

static void ssh1_connection_special_cmd(PacketProtocolLayer *ppl,
                                        SessionSpecialCode code, int arg)
{
    struct ssh1_connection_state *s =
        container_of(ppl, struct ssh1_connection_state, ppl);
    PktOut *pktout;

    if (code == SS_PING || code == SS_NOP) {
        if (!(s->ppl.remote_bugs & BUG_CHOKES_ON_SSH1_IGNORE)) {
            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_MSG_IGNORE);
            put_stringz(pktout, "");
            pq_push(s->ppl.out_pq, pktout);
        }
    } else if (s->mainchan) {
        mainchan_special_cmd(s->mainchan, code, arg);
    }
}